

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O1

void __thiscall ReplayingHammerer::ReplayingHammerer(ReplayingHammerer *this,Memory *mem)

{
  uint uVar1;
  long lVar2;
  size_t __i;
  ulong uVar3;
  ulong local_2730 [624];
  undefined8 local_13b0;
  undefined1 local_13a8 [8];
  random_device rd;
  
  this->mem = mem;
  (this->gen)._M_x[0] = 0x1571;
  uVar3 = 0x1571;
  lVar2 = 2;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2) - 1);
    (this->gen)._M_x[lVar2 + -1] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x271);
  (this->gen)._M_p = 0x270;
  (this->map_mapping_id_to_pattern)._M_h._M_buckets =
       &(this->map_mapping_id_to_pattern)._M_h._M_single_bucket;
  (this->map_mapping_id_to_pattern)._M_h._M_bucket_count = 1;
  (this->map_mapping_id_to_pattern)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map_mapping_id_to_pattern)._M_h._M_element_count = 0;
  (this->map_mapping_id_to_pattern)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map_mapping_id_to_pattern)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_mapping_id_to_pattern)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->initial_hammering_num_reps = 0x32;
  this->hammering_num_reps = 0x32;
  FuzzingParameterSet::FuzzingParameterSet(&this->params);
  std::random_device::random_device((random_device *)local_13a8);
  uVar1 = std::random_device::_M_getval();
  local_2730[0] = (ulong)uVar1;
  lVar2 = 1;
  uVar3 = local_2730[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_2730[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b0 = 0x270;
  memcpy(&this->gen,local_2730,5000);
  std::random_device::_M_fini();
  return;
}

Assistant:

ReplayingHammerer::ReplayingHammerer(Memory &mem) : mem(mem) { /* NOLINT */
  std::random_device rd;
  gen = std::mt19937(rd());
}